

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O1

string_t __thiscall
duckdb::VectorStringCastOperator<duckdb::VarIntCastToVarchar>::
Operation<duckdb::string_t,duckdb::string_t>
          (VectorStringCastOperator<duckdb::VarIntCastToVarchar> *this,string_t input,
          ValidityMask *mask,idx_t idx,void *dataptr)

{
  anon_union_16_2_67f50693_for_value aVar1;
  string_t data;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  string local_40;
  VectorStringCastOperator<duckdb::VarIntCastToVarchar> *local_20;
  undefined8 local_18;
  
  local_18 = input.value._0_8_;
  local_20 = this;
  Varint::VarIntToVarchar_abi_cxx11_(&local_40,(Varint *)&local_20,input.value._8_8_);
  if ((uint)local_40._M_string_length < 0xd) {
    uStack_44 = 0;
    uStack_4c = 0;
    uStack_48 = 0;
    if ((uint)local_40._M_string_length != 0) {
      switchD_00b1522a::default
                (&uStack_4c,local_40._M_dataplus._M_p,(ulong)((uint)local_40._M_string_length & 0xf)
                );
    }
  }
  else {
    uStack_4c = *(undefined4 *)local_40._M_dataplus._M_p;
    uStack_48 = SUB84(local_40._M_dataplus._M_p,0);
    uStack_44 = (undefined4)((ulong)local_40._M_dataplus._M_p >> 0x20);
  }
  data.value._4_1_ = (undefined1)uStack_44;
  data.value._5_1_ = uStack_44._1_1_;
  data.value._6_1_ = uStack_44._2_1_;
  data.value._7_1_ = uStack_44._3_1_;
  data.value.pointer.length = uStack_48;
  data.value.pointer.ptr = (char *)mask;
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::AddStringOrBlob
                 ((StringVector *)idx,(Vector *)CONCAT44(uStack_4c,(uint)local_40._M_string_length),
                  data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto result = reinterpret_cast<Vector *>(dataptr);
		return OP::template Operation<INPUT_TYPE>(input, *result);
	}